

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

uint dictionary_hash(char *key)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  
  if (key != (char *)0x0) {
    sVar1 = strlen(key);
    if (sVar1 == 0) {
      uVar3 = 0;
    }
    else {
      sVar2 = 0;
      uVar3 = 0;
      do {
        uVar3 = ((int)key[sVar2] + uVar3) * 0x401;
        uVar3 = uVar3 >> 6 ^ uVar3;
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
      uVar3 = uVar3 * 9;
    }
    return (uVar3 >> 0xb ^ uVar3) * 0x8001;
  }
  return 0;
}

Assistant:

unsigned dictionary_hash(const char * key)
{
    size_t      len ;
    unsigned    hash ;
    size_t      i ;

    if (!key)
        return 0 ;

    len = strlen(key);
    for (hash = 0, i = 0 ; i < len ; i++) {
        hash += (unsigned)key[i] ;
        hash += (hash << 10);
        hash ^= (hash >> 6) ;
    }
    hash += (hash << 3);
    hash ^= (hash >> 11);
    hash += (hash << 15);
    return hash ;
}